

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstorageinfo_linux.cpp
# Opt level: O1

QString * decodeFsEncString(QString *__return_storage_ptr__,QString *str)

{
  char16_t cVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  long lVar4;
  qsizetype qVar5;
  qsizetype qVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  
  qVar5 = QString::indexOf(str,(QChar)0x5c,0,CaseSensitive);
  if (qVar5 < 0) {
    pDVar2 = (str->d).d;
    pcVar3 = (str->d).ptr;
    (str->d).d = (Data *)0x0;
    (str->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = pDVar2;
    (__return_storage_ptr__->d).ptr = pcVar3;
    qVar5 = (str->d).size;
    (str->d).size = 0;
    (__return_storage_ptr__->d).size = qVar5;
  }
  else {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pDVar2 = (str->d).d;
    (str->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).d = pDVar2;
    pcVar3 = (str->d).ptr;
    (str->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).ptr = pcVar3;
    qVar6 = (str->d).size;
    (str->d).size = 0;
    (__return_storage_ptr__->d).size = qVar6;
    if ((pDVar2 == (Data *)0x0) ||
       (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
      QString::reallocData(__return_storage_ptr__,qVar6,KeepSize);
    }
    lVar4 = (__return_storage_ptr__->d).size;
    if (qVar5 < lVar4) {
      pcVar3 = (__return_storage_ptr__->d).ptr;
      qVar6 = qVar5;
      do {
        if ((qVar6 < lVar4 + -3) && (pcVar3[qVar6 + 1] == L'x')) {
          cVar1 = pcVar3[qVar6 + 2];
          uVar8 = (ushort)cVar1 - 0x30;
          if (9 < uVar8) {
            if ((ushort)cVar1 - 0x41 < 6) {
              uVar8 = (ushort)cVar1 - 0x37;
            }
            else {
              uVar8 = (ushort)cVar1 - 0x57;
              if (5 < (ushort)cVar1 - 0x61) {
                uVar8 = 0xffffffff;
              }
            }
          }
          cVar1 = pcVar3[qVar6 + 3];
          uVar9 = (ushort)cVar1 - 0x30;
          if (9 < uVar9) {
            if ((ushort)cVar1 - 0x41 < 6) {
              uVar9 = (ushort)cVar1 - 0x37;
            }
            else {
              uVar9 = (ushort)cVar1 - 0x57;
              if (5 < (ushort)cVar1 - 0x61) {
                uVar9 = 0xffffffff;
              }
            }
          }
          uVar9 = uVar8 << 4 | uVar9;
          if ((int)uVar9 < 0) {
            uVar9 = 0xfffd;
          }
          pcVar3[qVar5] = (char16_t)uVar9;
          qVar5 = qVar5 + 1;
          qVar6 = qVar6 + 4;
        }
        lVar7 = qVar6;
        if (qVar6 < lVar4) {
          do {
            lVar7 = qVar6;
            if (pcVar3[qVar6] == L'\\') break;
            pcVar3[qVar5] = pcVar3[qVar6];
            qVar5 = qVar5 + 1;
            qVar6 = qVar6 + 1;
            lVar7 = lVar4;
          } while (lVar4 != qVar6);
        }
        qVar6 = lVar7;
      } while (lVar7 < lVar4);
    }
    QString::resize(__return_storage_ptr__,qVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

static QString decodeFsEncString(QString &&str)
{
    using namespace QtMiscUtils;
    qsizetype start = str.indexOf(u'\\');
    if (start < 0)
        return std::move(str);

    // decode in-place
    QString decoded = std::move(str);
    auto ptr = reinterpret_cast<char16_t *>(decoded.begin());
    qsizetype in = start;
    qsizetype out = start;
    qsizetype size = decoded.size();

    while (in < size) {
        Q_ASSERT(ptr[in] == u'\\');
        if (size - in >= 4 && ptr[in + 1] == u'x') {    // we need four characters: \xAB
            int c = fromHex(ptr[in + 2]) << 4;
            c |= fromHex(ptr[in + 3]);
            if (Q_UNLIKELY(c < 0))
                c = QChar::ReplacementCharacter;        // bad hex sequence
            ptr[out++] = c;
            in += 4;
        }

        for ( ; in < size; ++in) {
            char16_t c = ptr[in];
            if (c == u'\\')
                break;
            ptr[out++] = c;
        }
    }
    decoded.resize(out);
    return decoded;
}